

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::MatMul_x86_avx::forward
          (MatMul_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  Allocator *pAVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  void **ppvVar15;
  pointer pMVar16;
  void *pvVar17;
  int iVar18;
  Option *pOVar19;
  void *pvVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  int iVar24;
  long lVar25;
  char cVar26;
  long *plVar27;
  void *pvVar28;
  long lVar29;
  Allocator *pAVar30;
  Mat *pMVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  Allocator *pAVar35;
  int iVar36;
  Mat *this_00;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  void *pvVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _bottom_blobs_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> _top_blobs;
  Mat local_1d8;
  Allocator *local_188;
  Allocator *local_180;
  Allocator *local_178;
  uint local_16c;
  Mat *local_168;
  allocator_type local_159;
  Mat *local_158;
  MatMul_x86_avx *local_150;
  Mat local_148;
  Mat *local_100;
  Mat local_f8;
  Option *local_b0;
  Mat *local_a8;
  Mat *local_a0;
  Mat local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_48;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar31 = this_00 + 1;
  local_100 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  uVar37 = this_00->dims;
  uVar38 = this_00[1].dims;
  uVar5 = uVar38;
  if ((int)uVar38 < (int)uVar37) {
    uVar5 = uVar37;
  }
  local_150 = this;
  local_b0 = opt;
  if ((uVar37 ^ 1) == 0 && (uVar38 ^ 1) == 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
               (allocator_type *)&local_1d8);
    Mat::reshape(&local_1d8,this_00,this_00->w,1,(Allocator *)0x0);
    pvVar28 = local_148.data;
    if ((Mat *)local_148.data != &local_1d8) {
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = *(int **)((long)local_148.data + 8);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
            if (*(void **)local_148.data != (void *)0x0) {
              free(*(void **)local_148.data);
            }
          }
          else {
            (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
          }
        }
      }
      *(size_t *)((long)pvVar28 + 0x40) = 0;
      *(void **)pvVar28 = (void *)0x0;
      *(int **)((long)pvVar28 + 8) = (int *)0x0;
      *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
      *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
      *(undefined8 *)((long)pvVar28 + 0x28) = 0;
      *(undefined8 *)((long)pvVar28 + 0x30) = 0;
      *(int *)((long)pvVar28 + 0x38) = 0;
      *(void **)pvVar28 = local_1d8.data;
      *(int **)((long)pvVar28 + 8) =
           (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      *(size_t *)((long)pvVar28 + 0x10) =
           CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      *(int *)((long)pvVar28 + 0x18) = local_1d8.elempack;
      *(Allocator **)((long)pvVar28 + 0x20) = local_1d8.allocator;
      *(ulong *)((long)pvVar28 + 0x28) = CONCAT44(local_1d8.w,local_1d8.dims);
      *(ulong *)((long)pvVar28 + 0x30) = CONCAT44(local_1d8.d,local_1d8.h);
      *(int *)((long)pvVar28 + 0x38) = local_1d8.c;
      *(size_t *)((long)pvVar28 + 0x40) = local_1d8.cstep;
    }
    piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          if (local_1d8.data != (void *)0x0) {
            free(local_1d8.data);
          }
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar24 = 1;
    iVar1 = this_00[1].w;
    if ((local_150->super_MatMul).transB == 0) {
      iVar24 = this_00[1].w;
      iVar1 = 1;
    }
    Mat::reshape(&local_1d8,pMVar31,iVar1,iVar24,(Allocator *)0x0);
    pMVar31 = local_100;
    if ((Mat *)((long)local_148.data + 0x48) != &local_1d8) {
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = ((Mat *)((long)local_148.data + 0x48))->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
            if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
              free(((Mat *)((long)local_148.data + 0x48))->data);
            }
          }
          else {
            (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
          }
        }
      }
      ((Mat *)((long)local_148.data + 0x48))->cstep = 0;
      *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->refcount + 4) = 0;
      *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->elemsize + 4) = 0;
      ((Mat *)((long)local_148.data + 0x48))->data = (void *)0x0;
      ((Mat *)((long)local_148.data + 0x48))->refcount = (int *)0x0;
      ((Mat *)((long)local_148.data + 0x48))->dims = 0;
      ((Mat *)((long)local_148.data + 0x48))->w = 0;
      ((Mat *)((long)local_148.data + 0x48))->h = 0;
      ((Mat *)((long)local_148.data + 0x48))->d = 0;
      ((Mat *)((long)local_148.data + 0x48))->c = 0;
      ((Mat *)((long)local_148.data + 0x48))->data = local_1d8.data;
      ((Mat *)((long)local_148.data + 0x48))->refcount =
           (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      ((Mat *)((long)local_148.data + 0x48))->elemsize =
           CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      ((Mat *)((long)local_148.data + 0x48))->elempack = local_1d8.elempack;
      ((Mat *)((long)local_148.data + 0x48))->allocator = local_1d8.allocator;
      ((Mat *)((long)local_148.data + 0x48))->dims = local_1d8.dims;
      ((Mat *)((long)local_148.data + 0x48))->w = local_1d8.w;
      ((Mat *)((long)local_148.data + 0x48))->h = local_1d8.h;
      ((Mat *)((long)local_148.data + 0x48))->d = local_1d8.d;
      ((Mat *)((long)local_148.data + 0x48))->c = local_1d8.c;
      ((Mat *)((long)local_148.data + 0x48))->cstep = local_1d8.cstep;
    }
    pOVar19 = local_b0;
    piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_1d8.allocator == (Allocator *)0x0) {
          if (local_1d8.data != (void *)0x0) {
            free(local_1d8.data);
          }
        }
        else {
          (*(local_1d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,pOVar19);
    Mat::reshape(&local_1d8,pMVar31,1,pOVar19->blob_allocator);
    if (pMVar31 != &local_1d8) {
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = pMVar31->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (pMVar31->allocator == (Allocator *)0x0) {
            if (pMVar31->data != (void *)0x0) {
              free(pMVar31->data);
            }
          }
          else {
            (*pMVar31->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar31->cstep = 0;
      pMVar31->data = (void *)0x0;
      pMVar31->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
      pMVar31->dims = 0;
      pMVar31->w = 0;
      pMVar31->h = 0;
      pMVar31->d = 0;
      pMVar31->c = 0;
      pMVar31->data = local_1d8.data;
      pMVar31->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      pMVar31->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
      pMVar31->elempack = local_1d8.elempack;
      pMVar31->allocator = local_1d8.allocator;
      pMVar31->dims = local_1d8.dims;
      pMVar31->w = local_1d8.w;
      pMVar31->h = local_1d8.h;
      pMVar31->d = local_1d8.d;
      pMVar31->c = local_1d8.c;
      pMVar31->cstep = local_1d8.cstep;
    }
    piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
    if (piVar2 == (int *)0x0) goto LAB_0059d4f7;
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) goto LAB_0059d4f7;
    if (local_1d8.allocator != (Allocator *)0x0) {
      (*(local_1d8.allocator)->_vptr_Allocator[3])();
      goto LAB_0059d4f7;
    }
  }
  else {
    if ((uVar37 ^ 2) == 0 && (uVar38 ^ 2) == 0) {
      (*this->gemm->_vptr_Layer[6])(this->gemm,bottom_blobs,top_blobs,opt);
      return 0;
    }
    if ((uVar37 ^ 1) == 0 && (uVar38 ^ 2) == 0) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
                 (allocator_type *)&local_1d8);
      Mat::reshape(&local_1d8,this_00,this_00->w,1,(Allocator *)0x0);
      pMVar31 = local_100;
      pvVar28 = local_148.data;
      if ((Mat *)local_148.data != &local_1d8) {
        piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = *(int **)((long)local_148.data + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
              if (*(void **)local_148.data != (void *)0x0) {
                free(*(void **)local_148.data);
              }
            }
            else {
              (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
            }
          }
        }
        *(size_t *)((long)pvVar28 + 0x40) = 0;
        *(void **)pvVar28 = (void *)0x0;
        *(int **)((long)pvVar28 + 8) = (int *)0x0;
        *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
        *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
        *(undefined8 *)((long)pvVar28 + 0x28) = 0;
        *(undefined8 *)((long)pvVar28 + 0x30) = 0;
        *(int *)((long)pvVar28 + 0x38) = 0;
        *(void **)pvVar28 = local_1d8.data;
        *(int **)((long)pvVar28 + 8) =
             (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        *(size_t *)((long)pvVar28 + 0x10) =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        *(int *)((long)pvVar28 + 0x18) = local_1d8.elempack;
        *(Allocator **)((long)pvVar28 + 0x20) = local_1d8.allocator;
        *(ulong *)((long)pvVar28 + 0x28) = CONCAT44(local_1d8.w,local_1d8.dims);
        *(ulong *)((long)pvVar28 + 0x30) = CONCAT44(local_1d8.d,local_1d8.h);
        *(int *)((long)pvVar28 + 0x38) = local_1d8.c;
        *(size_t *)((long)pvVar28 + 0x40) = local_1d8.cstep;
      }
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            if (local_1d8.data != (void *)0x0) {
              free(local_1d8.data);
            }
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((Mat *)local_148.data != this_00) {
        piVar2 = this_00[1].refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = ((Mat *)((long)local_148.data + 0x48))->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
              if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
                free(((Mat *)((long)local_148.data + 0x48))->data);
              }
            }
            else {
              (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
            }
          }
        }
        ((Mat *)((long)local_148.data + 0x48))->cstep = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->refcount + 4) = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->elemsize + 4) = 0;
        ((Mat *)((long)local_148.data + 0x48))->data = (void *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->refcount = (int *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->dims = 0;
        ((Mat *)((long)local_148.data + 0x48))->w = 0;
        ((Mat *)((long)local_148.data + 0x48))->h = 0;
        ((Mat *)((long)local_148.data + 0x48))->d = 0;
        ((Mat *)((long)local_148.data + 0x48))->c = 0;
        piVar2 = this_00[1].refcount;
        ((Mat *)((long)local_148.data + 0x48))->data = this_00[1].data;
        ((Mat *)((long)local_148.data + 0x48))->refcount = piVar2;
        ((Mat *)((long)local_148.data + 0x48))->elemsize = this_00[1].elemsize;
        ((Mat *)((long)local_148.data + 0x48))->elempack = this_00[1].elempack;
        ((Mat *)((long)local_148.data + 0x48))->allocator = this_00[1].allocator;
        iVar1 = this_00[1].w;
        iVar24 = this_00[1].h;
        iVar33 = this_00[1].d;
        ((Mat *)((long)local_148.data + 0x48))->dims = this_00[1].dims;
        ((Mat *)((long)local_148.data + 0x48))->w = iVar1;
        ((Mat *)((long)local_148.data + 0x48))->h = iVar24;
        ((Mat *)((long)local_148.data + 0x48))->d = iVar33;
        ((Mat *)((long)local_148.data + 0x48))->c = this_00[1].c;
        ((Mat *)((long)local_148.data + 0x48))->cstep = this_00[1].cstep;
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,local_b0);
      Mat::reshape(&local_1d8,pMVar31,pMVar31->w,local_b0->blob_allocator);
      if (pMVar31 != &local_1d8) {
        piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar31->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar31->allocator == (Allocator *)0x0) {
              if (pMVar31->data != (void *)0x0) {
                free(pMVar31->data);
              }
            }
            else {
              (*pMVar31->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar31->cstep = 0;
        pMVar31->data = (void *)0x0;
        pMVar31->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
        pMVar31->dims = 0;
        pMVar31->w = 0;
        pMVar31->h = 0;
        pMVar31->d = 0;
        pMVar31->c = 0;
        pMVar31->data = local_1d8.data;
        pMVar31->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar31->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        pMVar31->elempack = local_1d8.elempack;
        pMVar31->allocator = local_1d8.allocator;
        pMVar31->dims = local_1d8.dims;
        pMVar31->w = local_1d8.w;
        pMVar31->h = local_1d8.h;
        pMVar31->d = local_1d8.d;
        pMVar31->c = local_1d8.c;
        pMVar31->cstep = local_1d8.cstep;
      }
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 == (int *)0x0) goto LAB_0059d4f7;
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 != 0) goto LAB_0059d4f7;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_0059d4f7;
      }
    }
    else {
      if ((uVar37 ^ 2) != 0 || (uVar38 ^ 1) != 0) {
        sVar3 = this_00->elemsize;
        local_158 = this_00;
        if ((int)uVar38 < 3 || uVar37 != 1) {
          if ((int)uVar37 < 3 || uVar38 != 1) {
            if (uVar5 == 4) {
              if (uVar37 == 3) {
                Mat::reshape(&local_1d8,this_00,this_00->w,this_00->h,this_00->c,1,(Allocator *)0x0)
                ;
              }
              else {
                piVar2 = this_00->refcount;
                local_1d8.data = this_00->data;
                local_1d8.refcount._0_4_ = SUB84(this_00->refcount,0);
                local_1d8.refcount._4_4_ = (undefined4)((ulong)this_00->refcount >> 0x20);
                local_1d8.elemsize._0_4_ = (undefined4)this_00->elemsize;
                local_1d8.elemsize._4_4_ = (undefined4)(this_00->elemsize >> 0x20);
                local_1d8.elempack = this_00->elempack;
                local_1d8.allocator = this_00->allocator;
                uVar11 = this_00->dims;
                uVar12 = this_00->w;
                uVar13 = this_00->h;
                uVar14 = this_00->d;
                local_1d8.c = this_00->c;
                local_1d8.cstep = this_00->cstep;
                local_1d8.dims = uVar11;
                local_1d8.w = uVar12;
                local_1d8.h = uVar13;
                local_1d8.d = uVar14;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
              }
              if (uVar38 == 3) {
                Mat::reshape(&local_148,pMVar31,this_00[1].w,this_00[1].h,this_00[1].c,1,
                             (Allocator *)0x0);
              }
              else {
                piVar2 = this_00[1].refcount;
                local_148.data = this_00[1].data;
                local_148.refcount = this_00[1].refcount;
                local_148.elemsize = this_00[1].elemsize;
                local_148.elempack = this_00[1].elempack;
                local_148.allocator = this_00[1].allocator;
                local_148.dims = this_00[1].dims;
                local_148.w = this_00[1].w;
                local_148.h = this_00[1].h;
                local_148.d = this_00[1].d;
                local_148.c = this_00[1].c;
                local_148.cstep = this_00[1].cstep;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
              }
              pMVar31 = local_100;
              local_16c = local_148.d;
              if (local_148.d < local_1d8.d) {
                local_16c = local_1d8.d;
              }
              uVar37 = local_148.c;
              if (local_148.c < local_1d8.c) {
                uVar37 = local_1d8.c;
              }
              Mat::create(local_100,(&local_148.w)[(local_150->super_MatMul).transB != 0],
                          local_1d8.h,local_16c,uVar37,sVar3,opt->blob_allocator);
              if (pMVar31->data == (void *)0x0) {
                bVar42 = true;
              }
              else {
                bVar42 = (long)pMVar31->c * pMVar31->cstep == 0;
              }
              if (!bVar42) {
                if (0 < (int)uVar37) {
                  local_a0 = (Mat *)(ulong)uVar37;
                  local_188 = (Allocator *)(ulong)local_16c;
                  local_168 = (Mat *)0x0;
                  do {
                    if (0 < (int)local_16c) {
                      local_a8 = (Mat *)((ulong)local_168 & 0xffffffff);
                      local_158 = local_a8;
                      if (local_1d8.c == 1) {
                        local_158 = (Mat *)0x0;
                      }
                      if (local_148.c == 1) {
                        local_a8 = (Mat *)0x0;
                      }
                      pAVar35 = (Allocator *)0x0;
                      do {
                        iVar33 = local_1d8.d;
                        iVar36 = local_148.d;
                        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,2,
                                   (allocator_type *)&local_f8);
                        pvVar40 = local_98.data;
                        iVar24 = local_1d8.h;
                        iVar1 = local_1d8.w;
                        pvVar28 = local_1d8.data;
                        lVar25 = (long)local_1d8.w;
                        lVar32 = (long)local_1d8.h;
                        lVar41 = local_1d8.cstep * (long)local_158;
                        lVar29 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                        uVar39 = 0;
                        if (iVar33 != 1) {
                          uVar39 = (ulong)pAVar35 & 0xffffffff;
                        }
                        piVar2 = *(int **)((long)local_98.data + 8);
                        pAVar30 = local_1d8.allocator;
                        iVar33 = local_1d8.elempack;
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            if (*(long **)((long)local_98.data + 0x20) == (long *)0x0) {
                              if (*local_98.data != (void *)0x0) {
                                local_180 = (Allocator *)
                                            CONCAT44(local_180._4_4_,local_1d8.elempack);
                                local_178 = local_1d8.allocator;
                                free(*local_98.data);
                                pAVar30 = local_178;
                                iVar33 = (int)local_180;
                              }
                            }
                            else {
                              local_180 = (Allocator *)CONCAT44(local_180._4_4_,local_1d8.elempack);
                              local_178 = local_1d8.allocator;
                              (**(code **)(**(long **)((long)local_98.data + 0x20) + 0x18))();
                              pAVar30 = local_178;
                              iVar33 = (int)local_180;
                            }
                          }
                        }
                        pvVar20 = local_98.data;
                        iVar34 = local_148.elempack;
                        sVar3 = local_148.elemsize;
                        pvVar17 = local_148.data;
                        *(long *)pvVar40 = 0;
                        *(long *)((long)pvVar40 + 8) = 0;
                        *(undefined8 *)((long)pvVar40 + 0xc) = 0;
                        *(undefined8 *)((long)pvVar40 + 0x14) = 0;
                        *(long *)((long)pvVar40 + 0x28) = 0;
                        *(long *)((long)pvVar40 + 0x30) = 0;
                        *(ulong *)pvVar40 =
                             (long)pvVar28 + uVar39 * lVar32 * lVar25 * lVar29 + lVar41 * lVar29;
                        *(long *)((long)pvVar40 + 8) = 0;
                        *(long *)((long)pvVar40 + 0x10) = lVar29;
                        *(int *)((long)pvVar40 + 0x18) = iVar33;
                        *(Allocator **)((long)pvVar40 + 0x20) = pAVar30;
                        *(undefined4 *)((long)pvVar40 + 0x28) = 2;
                        *(int *)((long)pvVar40 + 0x2c) = iVar1;
                        *(int *)((long)pvVar40 + 0x30) = iVar24;
                        *(undefined4 *)((long)pvVar40 + 0x34) = 1;
                        *(undefined4 *)((long)pvVar40 + 0x38) = 1;
                        *(long *)((long)pvVar40 + 0x40) = lVar32 * lVar25;
                        iVar1 = local_148.w;
                        lVar29 = (long)local_148.w;
                        iVar24 = local_148.h;
                        lVar25 = (long)local_148.h;
                        lVar32 = local_148.cstep * (long)local_a8 * local_148.elemsize;
                        uVar39 = 0;
                        if (iVar36 != 1) {
                          uVar39 = (ulong)pAVar35 & 0xffffffff;
                        }
                        piVar2 = *(int **)((long)local_98.data + 0x50);
                        pAVar30 = local_148.allocator;
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            if (*(long **)((long)local_98.data + 0x68) == (long *)0x0) {
                              if (*(void **)((long)local_98.data + 0x48) != (void *)0x0) {
                                local_180 = local_148.allocator;
                                free(*(void **)((long)local_98.data + 0x48));
                                pAVar30 = local_180;
                              }
                            }
                            else {
                              local_180 = local_148.allocator;
                              (**(code **)(**(long **)((long)local_98.data + 0x68) + 0x18))();
                              pAVar30 = local_180;
                            }
                          }
                        }
                        *(long *)((long)pvVar20 + 0x88) = 0;
                        *(undefined8 *)((long)pvVar20 + 0x54) = 0;
                        *(undefined8 *)((long)pvVar20 + 0x5c) = 0;
                        *(long *)((long)pvVar20 + 0x48) = 0;
                        *(long *)((long)pvVar20 + 0x50) = 0;
                        *(long *)((long)pvVar20 + 0x70) = 0;
                        *(long *)((long)pvVar20 + 0x78) = 0;
                        *(ulong *)((long)pvVar20 + 0x48) =
                             (long)(void **)pvVar17 + uVar39 * lVar25 * lVar29 * sVar3 + lVar32;
                        *(long *)((long)pvVar20 + 0x50) = 0;
                        *(size_t *)((long)pvVar20 + 0x58) = sVar3;
                        *(int *)((long)pvVar20 + 0x60) = iVar34;
                        *(Allocator **)((long)pvVar20 + 0x68) = pAVar30;
                        *(undefined4 *)((long)pvVar20 + 0x70) = 2;
                        *(int *)((long)pvVar20 + 0x74) = iVar1;
                        *(int *)((long)pvVar20 + 0x78) = iVar24;
                        *(undefined4 *)((long)pvVar20 + 0x7c) = 1;
                        *(undefined4 *)((long)pvVar20 + 0x80) = 1;
                        *(long *)((long)pvVar20 + 0x88) = lVar25 * lVar29;
                        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8,1,
                                   (allocator_type *)&local_48);
                        pvVar40 = local_f8.data;
                        iVar1 = local_100->w;
                        iVar24 = local_100->h;
                        lVar29 = local_100->cstep * (long)local_168;
                        sVar3 = local_100->elemsize;
                        pvVar28 = local_100->data;
                        iVar33 = local_100->elempack;
                        pAVar30 = local_100->allocator;
                        piVar2 = *(int **)((long)local_f8.data + 8);
                        if (piVar2 != (int *)0x0) {
                          LOCK();
                          *piVar2 = *piVar2 + -1;
                          UNLOCK();
                          if (*piVar2 == 0) {
                            if (*(Allocator **)((long)local_f8.data + 0x20) == (Allocator *)0x0) {
                              if (*(void **)local_f8.data != (void *)0x0) {
                                free(*(void **)local_f8.data);
                              }
                            }
                            else {
                              (*(*(Allocator **)((long)local_f8.data + 0x20))->_vptr_Allocator[3])()
                              ;
                            }
                          }
                        }
                        sVar23 = (long)iVar24 * (long)iVar1;
                        *(void **)pvVar40 = (void *)0x0;
                        *(int **)((long)pvVar40 + 8) = (int *)0x0;
                        *(undefined8 *)((long)((long)pvVar40 + 8) + 4) = 0;
                        *(undefined8 *)((long)((long)pvVar40 + 0x10) + 4) = 0;
                        *(undefined8 *)((long)pvVar40 + 0x28) = 0;
                        *(undefined8 *)((long)pvVar40 + 0x30) = 0;
                        *(void **)pvVar40 =
                             (void *)((long)pvVar28 +
                                     (long)pAVar35 * sVar3 * sVar23 + lVar29 * sVar3);
                        *(int **)((long)pvVar40 + 8) = (int *)0x0;
                        *(size_t *)((long)pvVar40 + 0x10) = sVar3;
                        *(int *)((long)pvVar40 + 0x18) = iVar33;
                        *(Allocator **)((long)pvVar40 + 0x20) = pAVar30;
                        *(int *)((long)pvVar40 + 0x28) = 2;
                        *(int *)((long)pvVar40 + 0x2c) = iVar1;
                        *(int *)((long)pvVar40 + 0x30) = iVar24;
                        *(int *)((long)pvVar40 + 0x34) = 1;
                        *(int *)((long)pvVar40 + 0x38) = 1;
                        *(size_t *)((long)pvVar40 + 0x40) = sVar23;
                        (*local_150->gemm->_vptr_Layer[6])
                                  (local_150->gemm,&local_98,&local_f8,local_b0);
                        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8);
                        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
                        pAVar35 = (Allocator *)((long)&pAVar35->_vptr_Allocator + 1);
                      } while (local_188 != pAVar35);
                    }
                    local_168 = (Mat *)((long)&local_168->data + 1);
                  } while (local_168 != local_a0);
                }
                if (local_148.refcount != (int *)0x0) {
                  LOCK();
                  *local_148.refcount = *local_148.refcount + -1;
                  UNLOCK();
                  if (*local_148.refcount == 0) {
                    if (local_148.allocator == (Allocator *)0x0) {
                      if ((Mat *)local_148.data != (Mat *)0x0) {
                        free(local_148.data);
                      }
                    }
                    else {
                      (*(local_148.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (local_1d8.allocator == (Allocator *)0x0) {
                      if (local_1d8.data != (void *)0x0) {
                        free(local_1d8.data);
                      }
                    }
                    else {
                      (*(local_1d8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (!bVar42) {
                  return 0;
                }
                return -100;
              }
              if (local_148.refcount != (int *)0x0) {
                LOCK();
                *local_148.refcount = *local_148.refcount + -1;
                UNLOCK();
                if (*local_148.refcount == 0) {
                  if (local_148.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_148.data != (Mat *)0x0) {
                      free(local_148.data);
                    }
                  }
                  else {
                    (*(local_148.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar2 == (int *)0x0) {
                return -100;
              }
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 != 0) {
                return -100;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return -100;
              }
LAB_0059e600:
              if (local_1d8.data == (void *)0x0) {
                return -100;
              }
              free(local_1d8.data);
              return -100;
            }
            if (uVar5 != 3) {
              forward();
              return -1;
            }
            if (uVar37 == 2) {
              Mat::reshape(&local_1d8,this_00,this_00->w,this_00->h,1,(Allocator *)0x0);
            }
            else {
              piVar2 = this_00->refcount;
              local_1d8.data = this_00->data;
              local_1d8.refcount._0_4_ = SUB84(this_00->refcount,0);
              local_1d8.refcount._4_4_ = (undefined4)((ulong)this_00->refcount >> 0x20);
              local_1d8.elemsize._0_4_ = (undefined4)this_00->elemsize;
              local_1d8.elemsize._4_4_ = (undefined4)(this_00->elemsize >> 0x20);
              local_1d8.elempack = this_00->elempack;
              local_1d8.allocator = this_00->allocator;
              uVar7 = this_00->dims;
              uVar8 = this_00->w;
              uVar9 = this_00->h;
              uVar10 = this_00->d;
              local_1d8.c = this_00->c;
              local_1d8.cstep = this_00->cstep;
              local_1d8.dims = uVar7;
              local_1d8.w = uVar8;
              local_1d8.h = uVar9;
              local_1d8.d = uVar10;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
            }
            if (uVar38 == 2) {
              Mat::reshape(&local_148,pMVar31,this_00[1].w,this_00[1].h,1,(Allocator *)0x0);
            }
            else {
              piVar2 = this_00[1].refcount;
              local_148.data = this_00[1].data;
              local_148.refcount = this_00[1].refcount;
              local_148.elemsize = this_00[1].elemsize;
              local_148.elempack = this_00[1].elempack;
              local_148.allocator = this_00[1].allocator;
              local_148.dims = this_00[1].dims;
              local_148.w = this_00[1].w;
              local_148.h = this_00[1].h;
              local_148.d = this_00[1].d;
              local_148.c = this_00[1].c;
              local_148.cstep = this_00[1].cstep;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
            }
            pMVar31 = local_100;
            uVar37 = local_148.c;
            if (local_148.c < local_1d8.c) {
              uVar37 = local_1d8.c;
            }
            Mat::create(local_100,(&local_148.w)[(local_150->super_MatMul).transB != 0],local_1d8.h,
                        uVar37,sVar3,opt->blob_allocator);
            if (pMVar31->data == (void *)0x0) {
              bVar42 = true;
            }
            else {
              bVar42 = (long)pMVar31->c * pMVar31->cstep == 0;
            }
            if (bVar42) {
              if (local_148.refcount != (int *)0x0) {
                LOCK();
                *local_148.refcount = *local_148.refcount + -1;
                UNLOCK();
                if (*local_148.refcount == 0) {
                  if (local_148.allocator == (Allocator *)0x0) {
                    if ((Mat *)local_148.data != (Mat *)0x0) {
                      free(local_148.data);
                    }
                  }
                  else {
                    (*(local_148.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar2 == (int *)0x0) {
                return -100;
              }
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 != 0) {
                return -100;
              }
              if (local_1d8.allocator != (Allocator *)0x0) {
                (*(local_1d8.allocator)->_vptr_Allocator[3])();
                return -100;
              }
              goto LAB_0059e600;
            }
            local_178 = (Allocator *)((ulong)local_178 & 0xffffffffffffff00);
            if (0 < (int)uVar37) {
              local_a8 = (Mat *)(ulong)uVar37;
              local_168 = (Mat *)0x0;
              do {
                iVar34 = local_1d8.c;
                local_158 = (Mat *)CONCAT44(local_158._4_4_,local_148.c);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,2,
                           (allocator_type *)&local_f8);
                pvVar28 = local_98.data;
                iVar36 = local_1d8.d;
                iVar33 = local_1d8.h;
                iVar24 = local_1d8.w;
                iVar1 = local_1d8.dims;
                uVar39 = (ulong)local_168 & 0xffffffff;
                if (iVar34 == 1) {
                  uVar39 = 0;
                }
                uVar21 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                pvVar40 = (void *)(uVar39 * local_1d8.cstep * uVar21 + (long)local_1d8.data);
                uVar39 = (uVar21 * (long)local_1d8.h * (long)local_1d8.w + 0xf & 0xfffffffffffffff0)
                         / uVar21;
                if (local_1d8.dims == 4) {
                  uVar39 = (long)local_1d8.h * (long)local_1d8.w;
                }
                piVar2 = *(int **)((long)local_98.data + 8);
                pAVar35 = local_1d8.allocator;
                iVar34 = local_1d8.elempack;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    local_188 = local_1d8.allocator;
                    if (*(long **)((long)local_98.data + 0x20) == (long *)0x0) {
                      if (*local_98.data != (void *)0x0) {
                        local_180 = (Allocator *)CONCAT44(local_180._4_4_,local_1d8.elempack);
                        free(*local_98.data);
                        pAVar35 = local_188;
                        iVar34 = (int)local_180;
                      }
                    }
                    else {
                      local_180 = (Allocator *)CONCAT44(local_180._4_4_,local_1d8.elempack);
                      (**(code **)(**(long **)((long)local_98.data + 0x20) + 0x18))();
                      pAVar35 = local_188;
                      iVar34 = (int)local_180;
                    }
                  }
                }
                pvVar17 = local_98.data;
                pAVar30 = local_148.allocator;
                iVar18 = local_148.elempack;
                sVar3 = local_148.elemsize;
                uVar22 = (ulong)local_168 & 0xffffffff;
                *(long *)pvVar28 = 0;
                *(long *)((long)pvVar28 + 8) = 0;
                *(undefined8 *)((long)pvVar28 + 0xc) = 0;
                *(undefined8 *)((long)pvVar28 + 0x14) = 0;
                *(long *)((long)pvVar28 + 0x28) = 0;
                *(long *)((long)pvVar28 + 0x30) = 0;
                *(void **)pvVar28 = pvVar40;
                *(long *)((long)pvVar28 + 8) = 0;
                *(ulong *)((long)pvVar28 + 0x10) = uVar21;
                *(int *)((long)pvVar28 + 0x18) = iVar34;
                *(Allocator **)((long)pvVar28 + 0x20) = pAVar35;
                *(int *)((long)pvVar28 + 0x28) = iVar1 + -1;
                *(int *)((long)pvVar28 + 0x2c) = iVar24;
                *(int *)((long)pvVar28 + 0x30) = iVar33;
                *(undefined4 *)((long)pvVar28 + 0x34) = 1;
                *(int *)((long)pvVar28 + 0x38) = iVar36;
                *(ulong *)((long)pvVar28 + 0x40) = uVar39;
                pAVar35 = (Allocator *)(long)local_148.w;
                iVar1 = local_148.h;
                if ((int)local_158 == 1) {
                  uVar22 = 0;
                }
                lVar29 = uVar22 * local_148.cstep * local_148.elemsize;
                ppvVar15 = (void **)local_148.data;
                uVar21 = local_148.elemsize * (long)local_148.h * (long)pAVar35 + 0xf &
                         0xfffffffffffffff0;
                iVar24 = local_148.dims;
                uVar39 = uVar21 / local_148.elemsize;
                if (local_148.dims == 4) {
                  uVar39 = (long)local_148.h * (long)pAVar35;
                }
                piVar2 = *(int **)((long)local_98.data + 0x50);
                iVar33 = local_148.w;
                iVar36 = local_148.d;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    pvVar28 = *(void **)((long)local_98.data + 0x48);
                    plVar27 = *(long **)((long)local_98.data + 0x68);
                    if (plVar27 == (long *)0x0) {
                      if (pvVar28 != (void *)0x0) {
                        local_158 = (Mat *)CONCAT44(local_158._4_4_,local_148.d);
                        local_188 = pAVar35;
                        free(pvVar28);
                        iVar33 = (int)local_188;
                        iVar36 = (int)local_158;
                      }
                    }
                    else {
                      local_158 = (Mat *)CONCAT44(local_158._4_4_,local_148.d);
                      local_188 = pAVar35;
                      (**(code **)(*plVar27 + 0x18))(plVar27,pvVar28,uVar21 % local_148.elemsize);
                      iVar33 = (int)local_188;
                      iVar36 = (int)local_158;
                    }
                  }
                }
                *(long *)((long)pvVar17 + 0x88) = 0;
                *(undefined8 *)((long)pvVar17 + 0x54) = 0;
                *(undefined8 *)((long)pvVar17 + 0x5c) = 0;
                *(long *)((long)pvVar17 + 0x48) = 0;
                *(long *)((long)pvVar17 + 0x50) = 0;
                *(long *)((long)pvVar17 + 0x70) = 0;
                *(long *)((long)pvVar17 + 0x78) = 0;
                *(void ***)((long)pvVar17 + 0x48) = (void **)((long)ppvVar15 + lVar29);
                *(long *)((long)pvVar17 + 0x50) = 0;
                *(size_t *)((long)pvVar17 + 0x58) = sVar3;
                *(int *)((long)pvVar17 + 0x60) = iVar18;
                *(Allocator **)((long)pvVar17 + 0x68) = pAVar30;
                *(int *)((long)pvVar17 + 0x70) = iVar24 + -1;
                *(int *)((long)pvVar17 + 0x74) = iVar33;
                *(int *)((long)pvVar17 + 0x78) = iVar1;
                *(undefined4 *)((long)pvVar17 + 0x7c) = 1;
                *(int *)((long)pvVar17 + 0x80) = iVar36;
                *(ulong *)((long)pvVar17 + 0x88) = uVar39;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8,1,
                           (allocator_type *)&local_48);
                pvVar28 = local_f8.data;
                pMVar31 = (Mat *)(long)local_100->w;
                pAVar35 = (Allocator *)(long)local_100->h;
                uVar39 = local_100->elemsize;
                uVar21 = ((long)pAVar35 * (long)pMVar31 * uVar39 + 0xf & 0xfffffffffffffff0) /
                         uVar39;
                iVar1 = local_100->dims;
                if (iVar1 == 4) {
                  uVar21 = (long)local_100->h * (long)local_100->w;
                }
                iVar24 = local_100->d;
                lVar29 = local_100->cstep * (long)local_168;
                pvVar40 = local_100->data;
                iVar33 = local_100->elempack;
                pAVar30 = local_100->allocator;
                piVar2 = *(int **)((long)local_f8.data + 8);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (*(Allocator **)((long)local_f8.data + 0x20) == (Allocator *)0x0) {
                      if (*(void **)local_f8.data != (void *)0x0) {
                        local_188 = pAVar35;
                        local_158 = pMVar31;
                        free(*(void **)local_f8.data);
                        pMVar31 = local_158;
                        pAVar35 = local_188;
                      }
                    }
                    else {
                      local_188 = pAVar35;
                      local_158 = pMVar31;
                      (*(*(Allocator **)((long)local_f8.data + 0x20))->_vptr_Allocator[3])();
                      pMVar31 = local_158;
                      pAVar35 = local_188;
                    }
                  }
                }
                *(void **)pvVar28 = (void *)0x0;
                *(int **)((long)pvVar28 + 8) = (int *)0x0;
                *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
                *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
                *(undefined8 *)((long)pvVar28 + 0x28) = 0;
                *(undefined8 *)((long)pvVar28 + 0x30) = 0;
                *(void **)pvVar28 = (void *)(lVar29 * uVar39 + (long)pvVar40);
                *(int **)((long)pvVar28 + 8) = (int *)0x0;
                *(ulong *)((long)pvVar28 + 0x10) = uVar39;
                *(int *)((long)pvVar28 + 0x18) = iVar33;
                *(Allocator **)((long)pvVar28 + 0x20) = pAVar30;
                *(int *)((long)pvVar28 + 0x28) = iVar1 + -1;
                *(int *)((long)pvVar28 + 0x2c) = (int)pMVar31;
                *(int *)((long)pvVar28 + 0x30) = (int)pAVar35;
                *(int *)((long)pvVar28 + 0x34) = 1;
                *(int *)((long)pvVar28 + 0x38) = iVar24;
                *(ulong *)((long)pvVar28 + 0x40) = uVar21;
                (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_98,&local_f8,local_b0);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8);
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
                local_168 = (Mat *)((long)&local_168->data + 1);
              } while (local_a8 != local_168);
            }
            if (local_148.refcount != (int *)0x0) {
              LOCK();
              *local_148.refcount = *local_148.refcount + -1;
              UNLOCK();
              if (*local_148.refcount == 0) {
                if (local_148.allocator == (Allocator *)0x0) {
                  if ((Mat *)local_148.data != (Mat *)0x0) {
                    free(local_148.data);
                  }
                }
                else {
                  (*(local_148.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar2 != (int *)0x0) {
              LOCK();
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (*piVar2 == 0) {
                if (local_1d8.allocator == (Allocator *)0x0) {
                  if (local_1d8.data != (void *)0x0) {
                    free(local_1d8.data);
                  }
                }
                else {
                  (*(local_1d8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            cVar26 = (char)local_178;
            goto joined_r0x0059e928;
          }
          local_16c = this_00->h;
          uVar38 = this_00->c * this_00->d;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          Mat::create(&local_1d8,1,local_16c,uVar38,sVar3,opt->blob_allocator);
          bVar42 = local_1d8.data == (void *)0x0;
          bVar43 = (long)local_1d8.c * local_1d8.cstep == 0;
          if (bVar42 || bVar43) {
            piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar2 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 != 0) {
              return -100;
            }
            if (local_1d8.allocator != (Allocator *)0x0) {
              (*(local_1d8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
            goto LAB_0059e2ff;
          }
          Mat::reshape(&local_148,this_00,this_00->w,this_00->h,uVar38,(Allocator *)0x0);
          local_a0 = (Mat *)CONCAT71(local_a0._1_7_,bVar42 || bVar43);
          iVar24 = 1;
          iVar1 = this_00[1].w;
          if ((local_150->super_MatMul).transB == 0) {
            iVar24 = this_00[1].w;
            iVar1 = 1;
          }
          Mat::reshape(&local_98,pMVar31,iVar1,iVar24,(Allocator *)0x0);
          if (0 < (int)uVar38) {
            local_a8 = (Mat *)(ulong)uVar38;
            pMVar31 = (Mat *)0x0;
            do {
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8,2,
                         (allocator_type *)&local_48);
              pvVar28 = local_f8.data;
              sVar3 = local_148.elemsize;
              iVar24 = local_148.w;
              pAVar35 = (Allocator *)(long)local_148.h;
              iVar33 = local_148.d;
              lVar29 = local_148.cstep * (long)pMVar31 * local_148.elemsize;
              ppvVar15 = (void **)local_148.data;
              uVar21 = local_148.elemsize * (long)pAVar35 * (long)local_148.w + 0xf &
                       0xfffffffffffffff0;
              iVar1 = local_148.dims;
              uVar39 = uVar21 / local_148.elemsize;
              if (local_148.dims == 4) {
                uVar39 = (long)pAVar35 * (long)local_148.w;
              }
              piVar2 = *(int **)((long)local_f8.data + 8);
              pAVar30 = local_148.allocator;
              iVar36 = local_148.elempack;
              iVar34 = local_148.h;
              local_168 = pMVar31;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  local_188 = local_148.allocator;
                  pvVar40 = *(void **)local_f8.data;
                  pAVar4 = *(Allocator **)((long)local_f8.data + 0x20);
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar40 != (void *)0x0) {
                      local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_148.elempack);
                      local_180 = pAVar35;
                      free(pvVar40);
                      iVar34 = (int)local_180;
                      pAVar30 = local_188;
                      iVar36 = (int)local_178;
                    }
                  }
                  else {
                    local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_148.elempack);
                    local_180 = pAVar35;
                    (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar40,uVar21 % local_148.elemsize);
                    pAVar30 = local_188;
                    iVar36 = (int)local_178;
                    iVar34 = (int)local_180;
                  }
                }
              }
              pvVar40 = local_f8.data;
              *(void **)pvVar28 = (void *)0x0;
              *(int **)((long)pvVar28 + 8) = (int *)0x0;
              *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
              *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
              *(undefined8 *)((long)pvVar28 + 0x28) = 0;
              *(undefined8 *)((long)pvVar28 + 0x30) = 0;
              *(void **)pvVar28 = (void **)((long)ppvVar15 + lVar29);
              *(int **)((long)pvVar28 + 8) = (int *)0x0;
              *(size_t *)((long)pvVar28 + 0x10) = sVar3;
              *(int *)((long)pvVar28 + 0x18) = iVar36;
              *(Allocator **)((long)pvVar28 + 0x20) = pAVar30;
              *(int *)((long)pvVar28 + 0x28) = iVar1 + -1;
              *(int *)((long)pvVar28 + 0x2c) = iVar24;
              *(int *)((long)pvVar28 + 0x30) = iVar34;
              *(int *)((long)pvVar28 + 0x34) = 1;
              *(int *)((long)pvVar28 + 0x38) = iVar33;
              *(ulong *)((long)pvVar28 + 0x40) = uVar39;
              pMVar31 = (Mat *)((long)local_f8.data + 0x48);
              if (pMVar31 != &local_98) {
                if (local_98.refcount != (int *)0x0) {
                  LOCK();
                  *local_98.refcount = *local_98.refcount + 1;
                  UNLOCK();
                }
                piVar2 = ((Mat *)((long)local_f8.data + 0x48))->refcount;
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (((Mat *)((long)local_f8.data + 0x48))->allocator == (Allocator *)0x0) {
                      if (((Mat *)((long)local_f8.data + 0x48))->data != (void *)0x0) {
                        free(((Mat *)((long)local_f8.data + 0x48))->data);
                      }
                    }
                    else {
                      (*((Mat *)((long)local_f8.data + 0x48))->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                ((Mat *)((long)pvVar40 + 0x48))->cstep = 0;
                *(undefined8 *)((long)&((Mat *)((long)pvVar40 + 0x48))->refcount + 4) = 0;
                *(undefined8 *)((long)&((Mat *)((long)pvVar40 + 0x48))->elemsize + 4) = 0;
                pMVar31->data = (void *)0x0;
                ((Mat *)((long)pvVar40 + 0x48))->refcount = (int *)0x0;
                ((Mat *)((long)pvVar40 + 0x48))->dims = 0;
                ((Mat *)((long)pvVar40 + 0x48))->w = 0;
                ((Mat *)((long)pvVar40 + 0x48))->h = 0;
                ((Mat *)((long)pvVar40 + 0x48))->d = 0;
                ((Mat *)((long)pvVar40 + 0x48))->c = 0;
                ((Mat *)((long)pvVar40 + 0x48))->data = local_98.data;
                ((Mat *)((long)pvVar40 + 0x48))->refcount = local_98.refcount;
                ((Mat *)((long)pvVar40 + 0x48))->elemsize = local_98.elemsize;
                ((Mat *)((long)pvVar40 + 0x48))->elempack = local_98.elempack;
                ((Mat *)((long)pvVar40 + 0x48))->allocator = local_98.allocator;
                ((Mat *)((long)pvVar40 + 0x48))->dims = local_98.dims;
                ((Mat *)((long)pvVar40 + 0x48))->w = local_98.w;
                ((Mat *)((long)pvVar40 + 0x48))->h = local_98.h;
                ((Mat *)((long)pvVar40 + 0x48))->d = local_98.d;
                ((Mat *)((long)pvVar40 + 0x48))->c = local_98.c;
                ((Mat *)((long)pvVar40 + 0x48))->cstep = local_98.cstep;
              }
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_48,1,&local_159);
              pMVar16 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar33 = local_1d8.d;
              iVar24 = local_1d8.w;
              iVar1 = local_1d8.dims;
              pAVar35 = (Allocator *)(long)local_1d8.h;
              uVar39 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
              pvVar28 = (void *)(local_1d8.cstep * (long)local_168 * uVar39 + (long)local_1d8.data);
              uVar22 = uVar39 * (long)pAVar35 * (long)local_1d8.w + 0xf & 0xfffffffffffffff0;
              uVar21 = uVar22 / uVar39;
              if (local_1d8.dims == 4) {
                uVar21 = (long)pAVar35 * (long)local_1d8.w;
              }
              piVar2 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start)->refcount;
              pAVar30 = local_1d8.allocator;
              iVar36 = local_1d8.elempack;
              iVar34 = local_1d8.h;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  local_188 = local_1d8.allocator;
                  pvVar40 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data;
                  pAVar4 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start)->allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar40 != (void *)0x0) {
                      local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_1d8.elempack);
                      local_180 = pAVar35;
                      free(pvVar40);
                      iVar34 = (int)local_180;
                      pAVar30 = local_188;
                      iVar36 = (int)local_178;
                    }
                  }
                  else {
                    local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_1d8.elempack);
                    local_180 = pAVar35;
                    (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar40,uVar22 % uVar39);
                    pAVar30 = local_188;
                    iVar36 = (int)local_178;
                    iVar34 = (int)local_180;
                  }
                }
              }
              pMVar16->data = (void *)0x0;
              pMVar16->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar16->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar16->elemsize + 4) = 0;
              pMVar16->dims = 0;
              pMVar16->w = 0;
              pMVar16->h = 0;
              pMVar16->d = 0;
              pMVar16->data = pvVar28;
              pMVar16->refcount = (int *)0x0;
              pMVar16->elemsize = uVar39;
              pMVar16->elempack = iVar36;
              pMVar16->allocator = pAVar30;
              pMVar16->dims = iVar1 + -1;
              pMVar16->w = iVar24;
              pMVar16->h = iVar34;
              pMVar16->d = 1;
              pMVar16->c = iVar33;
              pMVar16->cstep = uVar21;
              (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_f8,&local_48,local_b0);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8);
              pMVar31 = (Mat *)((long)&local_168->data + 1);
              this_00 = local_158;
            } while (local_a8 != pMVar31);
          }
          pMVar31 = local_100;
          if (uVar37 == 3) {
            Mat::reshape(&local_f8,&local_1d8,local_16c,this_00->c * this_00->d,
                         local_b0->blob_allocator);
            if (pMVar31 != &local_f8) {
              if (local_f8.refcount != (int *)0x0) {
                LOCK();
                *local_f8.refcount = *local_f8.refcount + 1;
                UNLOCK();
              }
              piVar2 = pMVar31->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (pMVar31->allocator == (Allocator *)0x0) {
                    if (pMVar31->data != (void *)0x0) {
                      free(pMVar31->data);
                    }
                  }
                  else {
                    (*pMVar31->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar31->cstep = 0;
              pMVar31->data = (void *)0x0;
              pMVar31->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
              pMVar31->dims = 0;
              pMVar31->w = 0;
              pMVar31->h = 0;
              pMVar31->d = 0;
              pMVar31->c = 0;
              pMVar31->data = local_f8.data;
              pMVar31->refcount = local_f8.refcount;
              pMVar31->elemsize = local_f8.elemsize;
              pMVar31->elempack = local_f8.elempack;
              pMVar31->allocator = local_f8.allocator;
              pMVar31->dims = local_f8.dims;
              pMVar31->w = local_f8.w;
              pMVar31->h = local_f8.h;
              pMVar31->d = local_f8.d;
              pMVar31->c = local_f8.c;
              pMVar31->cstep = local_f8.cstep;
            }
            cVar26 = (char)local_a0;
            if (local_f8.refcount != (int *)0x0) {
              LOCK();
              *local_f8.refcount = *local_f8.refcount + -1;
              UNLOCK();
              if (*local_f8.refcount == 0) {
                if (local_f8.allocator == (Allocator *)0x0) {
LAB_0059e840:
                  if ((Mat *)local_f8.data != (Mat *)0x0) {
                    free(local_f8.data);
                  }
                }
                else {
                  (*(local_f8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape(&local_f8,&local_1d8,local_16c,this_00->d,this_00->c,
                         local_b0->blob_allocator);
            if (pMVar31 != &local_f8) {
              if (local_f8.refcount != (int *)0x0) {
                LOCK();
                *local_f8.refcount = *local_f8.refcount + 1;
                UNLOCK();
              }
              piVar2 = pMVar31->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (pMVar31->allocator == (Allocator *)0x0) {
                    if (pMVar31->data != (void *)0x0) {
                      free(pMVar31->data);
                    }
                  }
                  else {
                    (*pMVar31->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar31->cstep = 0;
              pMVar31->data = (void *)0x0;
              pMVar31->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
              pMVar31->dims = 0;
              pMVar31->w = 0;
              pMVar31->h = 0;
              pMVar31->d = 0;
              pMVar31->c = 0;
              pMVar31->data = local_f8.data;
              pMVar31->refcount = local_f8.refcount;
              pMVar31->elemsize = local_f8.elemsize;
              pMVar31->elempack = local_f8.elempack;
              pMVar31->allocator = local_f8.allocator;
              pMVar31->dims = local_f8.dims;
              pMVar31->w = local_f8.w;
              pMVar31->h = local_f8.h;
              pMVar31->d = local_f8.d;
              pMVar31->c = local_f8.c;
              pMVar31->cstep = local_f8.cstep;
            }
            cVar26 = (char)local_a0;
            if (local_f8.refcount != (int *)0x0) {
              LOCK();
              *local_f8.refcount = *local_f8.refcount + -1;
              UNLOCK();
              if (*local_f8.refcount == 0) {
                if (local_f8.allocator == (Allocator *)0x0) goto LAB_0059e840;
                (*(local_f8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + -1;
            UNLOCK();
            if (*local_98.refcount == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if ((long *)local_98.data != (long *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_148.refcount != (int *)0x0) {
            LOCK();
            *local_148.refcount = *local_148.refcount + -1;
            UNLOCK();
            if (*local_148.refcount == 0) {
              if (local_148.allocator == (Allocator *)0x0) {
                if ((Mat *)local_148.data != (Mat *)0x0) {
                  free(local_148.data);
                }
              }
              else {
                (*(local_148.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar2 == (int *)0x0) goto joined_r0x0059e928;
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 != 0) goto joined_r0x0059e928;
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            goto joined_r0x0059e928;
          }
        }
        else {
          local_a0 = (Mat *)CONCAT44(local_a0._4_4_,uVar38);
          local_16c = (&this_00[1].w)[(this->super_MatMul).transB != 0];
          uVar37 = this_00[1].c * this_00[1].d;
          local_1d8.cstep = 0;
          local_1d8.data = (void *)0x0;
          local_1d8.refcount._0_4_ = 0;
          local_1d8.refcount._4_4_ = 0;
          local_1d8.elemsize._0_4_ = 0;
          local_1d8.elemsize._4_4_ = 0;
          local_1d8.elempack = 0;
          local_1d8.allocator = (Allocator *)0x0;
          local_1d8.dims = 0;
          local_1d8.w = 0;
          local_1d8.h = 0;
          local_1d8.d = 0;
          local_1d8.c = 0;
          Mat::create(&local_1d8,local_16c,1,uVar37,sVar3,opt->blob_allocator);
          bVar42 = (long)local_1d8.c * local_1d8.cstep == 0;
          cVar26 = local_1d8.data == (void *)0x0 || bVar42;
          if (local_1d8.data == (void *)0x0 || bVar42) {
            piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
            if (piVar2 == (int *)0x0) {
              return -100;
            }
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 != 0) {
              return -100;
            }
            if (local_1d8.allocator != (Allocator *)0x0) {
              (*(local_1d8.allocator)->_vptr_Allocator[3])();
              return -100;
            }
LAB_0059e2ff:
            if (local_1d8.data != (void *)0x0) {
              free(local_1d8.data);
            }
            return -100;
          }
          Mat::reshape(&local_148,this_00,this_00->w,1,(Allocator *)0x0);
          Mat::reshape(&local_98,pMVar31,this_00[1].w,this_00[1].h,uVar37,(Allocator *)0x0);
          if (0 < (int)uVar37) {
            local_a8 = (Mat *)(ulong)uVar37;
            pMVar31 = (Mat *)0x0;
            do {
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8,2,
                         (allocator_type *)&local_48);
              pvVar28 = local_f8.data;
              if ((Mat *)local_f8.data != &local_148) {
                if (local_148.refcount != (int *)0x0) {
                  LOCK();
                  *local_148.refcount = *local_148.refcount + 1;
                  UNLOCK();
                }
                piVar2 = *(int **)((long)local_f8.data + 8);
                if (piVar2 != (int *)0x0) {
                  LOCK();
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (*piVar2 == 0) {
                    if (*(Allocator **)((long)local_f8.data + 0x20) == (Allocator *)0x0) {
                      if (*(void **)local_f8.data != (void *)0x0) {
                        free(*(void **)local_f8.data);
                      }
                    }
                    else {
                      (*(*(Allocator **)((long)local_f8.data + 0x20))->_vptr_Allocator[3])();
                    }
                  }
                }
                *(size_t *)((long)pvVar28 + 0x40) = 0;
                *(void **)pvVar28 = (void *)0x0;
                *(int **)((long)pvVar28 + 8) = (int *)0x0;
                *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
                *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
                *(undefined8 *)((long)pvVar28 + 0x28) = 0;
                *(undefined8 *)((long)pvVar28 + 0x30) = 0;
                *(int *)((long)pvVar28 + 0x38) = 0;
                *(void **)pvVar28 = local_148.data;
                *(int **)((long)pvVar28 + 8) = local_148.refcount;
                *(size_t *)((long)pvVar28 + 0x10) = local_148.elemsize;
                *(int *)((long)pvVar28 + 0x18) = local_148.elempack;
                *(Allocator **)((long)pvVar28 + 0x20) = local_148.allocator;
                *(undefined8 *)((long)pvVar28 + 0x28) = local_148._40_8_;
                *(undefined8 *)((long)pvVar28 + 0x30) = local_148._48_8_;
                *(int *)((long)pvVar28 + 0x38) = local_148.c;
                *(size_t *)((long)pvVar28 + 0x40) = local_148.cstep;
              }
              iVar33 = local_98.d;
              iVar24 = local_98.w;
              iVar1 = local_98.dims;
              sVar3 = local_98.elemsize;
              pvVar28 = local_f8.data;
              pAVar35 = (Allocator *)(long)local_98.h;
              plVar27 = (long *)((long)local_98.data +
                                local_98.cstep * (long)pMVar31 * local_98.elemsize);
              uVar21 = local_98.elemsize * (long)pAVar35 * (long)local_98.w + 0xf &
                       0xfffffffffffffff0;
              uVar39 = uVar21 / local_98.elemsize;
              if (local_98.dims == 4) {
                uVar39 = (long)pAVar35 * (long)local_98.w;
              }
              piVar2 = ((Mat *)((long)local_f8.data + 0x48))->refcount;
              pAVar30 = local_98.allocator;
              iVar36 = local_98.elempack;
              iVar34 = local_98.h;
              local_168 = pMVar31;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  local_188 = local_98.allocator;
                  pvVar40 = ((Mat *)((long)local_f8.data + 0x48))->data;
                  pAVar4 = ((Mat *)((long)local_f8.data + 0x48))->allocator;
                  if (pAVar4 == (Allocator *)0x0) {
                    if (pvVar40 != (void *)0x0) {
                      local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_98.elempack);
                      local_180 = pAVar35;
                      free(pvVar40);
                      iVar34 = (int)local_180;
                      pAVar30 = local_188;
                      iVar36 = (int)local_178;
                    }
                  }
                  else {
                    local_178 = (Allocator *)CONCAT44(local_178._4_4_,local_98.elempack);
                    local_180 = pAVar35;
                    (*pAVar4->_vptr_Allocator[3])(pAVar4,pvVar40,uVar21 % local_98.elemsize);
                    pAVar30 = local_188;
                    iVar36 = (int)local_178;
                    iVar34 = (int)local_180;
                  }
                }
              }
              ((Mat *)((long)pvVar28 + 0x48))->cstep = 0;
              *(undefined8 *)((long)&((Mat *)((long)pvVar28 + 0x48))->refcount + 4) = 0;
              *(undefined8 *)((long)&((Mat *)((long)pvVar28 + 0x48))->elemsize + 4) = 0;
              ((Mat *)((long)pvVar28 + 0x48))->data = (void *)0x0;
              ((Mat *)((long)pvVar28 + 0x48))->refcount = (int *)0x0;
              ((Mat *)((long)pvVar28 + 0x48))->dims = 0;
              ((Mat *)((long)pvVar28 + 0x48))->w = 0;
              ((Mat *)((long)pvVar28 + 0x48))->h = 0;
              ((Mat *)((long)pvVar28 + 0x48))->d = 0;
              ((Mat *)((long)pvVar28 + 0x48))->data = plVar27;
              ((Mat *)((long)pvVar28 + 0x48))->refcount = (int *)0x0;
              ((Mat *)((long)pvVar28 + 0x48))->elemsize = sVar3;
              ((Mat *)((long)pvVar28 + 0x48))->elempack = iVar36;
              ((Mat *)((long)pvVar28 + 0x48))->allocator = pAVar30;
              ((Mat *)((long)pvVar28 + 0x48))->dims = iVar1 + -1;
              ((Mat *)((long)pvVar28 + 0x48))->w = iVar24;
              ((Mat *)((long)pvVar28 + 0x48))->h = iVar34;
              ((Mat *)((long)pvVar28 + 0x48))->d = 1;
              ((Mat *)((long)pvVar28 + 0x48))->c = iVar33;
              ((Mat *)((long)pvVar28 + 0x48))->cstep = uVar39;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_48,1,&local_159);
              pMVar16 = local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar36 = local_1d8.h;
              iVar33 = local_1d8.w;
              iVar24 = local_1d8.dims;
              iVar1 = local_1d8.elempack;
              uVar39 = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
              pvVar28 = (void *)(local_1d8.cstep * (long)local_168 * uVar39 + (long)local_1d8.data);
              uVar22 = uVar39 * (long)local_1d8.h * (long)local_1d8.w + 0xf & 0xfffffffffffffff0;
              uVar21 = uVar22 / uVar39;
              if (local_1d8.dims == 4) {
                uVar21 = (long)local_1d8.h * (long)local_1d8.w;
              }
              piVar2 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start)->refcount;
              pAVar35 = local_1d8.allocator;
              iVar34 = local_1d8.d;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  pvVar40 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data;
                  pAVar30 = (local_48.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->allocator;
                  if (pAVar30 == (Allocator *)0x0) {
                    if (pvVar40 != (void *)0x0) {
                      local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_1d8.d);
                      local_180 = local_1d8.allocator;
                      free(pvVar40);
                      pAVar35 = local_180;
                      iVar34 = (int)local_188;
                    }
                  }
                  else {
                    local_188 = (Allocator *)CONCAT44(local_188._4_4_,local_1d8.d);
                    local_180 = local_1d8.allocator;
                    (*pAVar30->_vptr_Allocator[3])(pAVar30,pvVar40,uVar22 % uVar39);
                    pAVar35 = local_180;
                    iVar34 = (int)local_188;
                  }
                }
              }
              opt = local_b0;
              pMVar16->data = (void *)0x0;
              pMVar16->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar16->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar16->elemsize + 4) = 0;
              pMVar16->dims = 0;
              pMVar16->w = 0;
              pMVar16->h = 0;
              pMVar16->d = 0;
              pMVar16->data = pvVar28;
              pMVar16->refcount = (int *)0x0;
              pMVar16->elemsize = uVar39;
              pMVar16->elempack = iVar1;
              pMVar16->allocator = pAVar35;
              pMVar16->dims = iVar24 + -1;
              pMVar16->w = iVar33;
              pMVar16->h = iVar36;
              pMVar16->d = 1;
              pMVar16->c = iVar34;
              pMVar16->cstep = uVar21;
              (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_f8,&local_48,local_b0);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_48);
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f8);
              pMVar31 = (Mat *)((long)&local_168->data + 1);
              this_00 = local_158;
            } while (local_a8 != pMVar31);
          }
          pMVar31 = local_100;
          if ((int)local_a0 == 3) {
            Mat::reshape(&local_f8,&local_1d8,local_16c,this_00[1].c * this_00[1].d,
                         opt->blob_allocator);
            if (pMVar31 != &local_f8) {
              if (local_f8.refcount != (int *)0x0) {
                LOCK();
                *local_f8.refcount = *local_f8.refcount + 1;
                UNLOCK();
              }
              piVar2 = pMVar31->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (pMVar31->allocator == (Allocator *)0x0) {
                    if (pMVar31->data != (void *)0x0) {
                      free(pMVar31->data);
                    }
                  }
                  else {
                    (*pMVar31->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar31->cstep = 0;
              pMVar31->data = (void *)0x0;
              pMVar31->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
              pMVar31->dims = 0;
              pMVar31->w = 0;
              pMVar31->h = 0;
              pMVar31->d = 0;
              pMVar31->c = 0;
              pMVar31->data = local_f8.data;
              pMVar31->refcount = local_f8.refcount;
              pMVar31->elemsize = local_f8.elemsize;
              pMVar31->elempack = local_f8.elempack;
              pMVar31->allocator = local_f8.allocator;
              pMVar31->dims = local_f8.dims;
              pMVar31->w = local_f8.w;
              pMVar31->h = local_f8.h;
              pMVar31->d = local_f8.d;
              pMVar31->c = local_f8.c;
              pMVar31->cstep = local_f8.cstep;
            }
            if (local_f8.refcount != (int *)0x0) {
              LOCK();
              *local_f8.refcount = *local_f8.refcount + -1;
              UNLOCK();
              if (*local_f8.refcount == 0) {
                if (local_f8.allocator == (Allocator *)0x0) {
LAB_0059e4b6:
                  if ((Mat *)local_f8.data != (Mat *)0x0) {
                    free(local_f8.data);
                  }
                }
                else {
                  (*(local_f8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            Mat::reshape(&local_f8,&local_1d8,local_16c,this_00[1].d,this_00[1].c,
                         opt->blob_allocator);
            if (pMVar31 != &local_f8) {
              if (local_f8.refcount != (int *)0x0) {
                LOCK();
                *local_f8.refcount = *local_f8.refcount + 1;
                UNLOCK();
              }
              piVar2 = pMVar31->refcount;
              if (piVar2 != (int *)0x0) {
                LOCK();
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (*piVar2 == 0) {
                  if (pMVar31->allocator == (Allocator *)0x0) {
                    if (pMVar31->data != (void *)0x0) {
                      free(pMVar31->data);
                    }
                  }
                  else {
                    (*pMVar31->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar31->cstep = 0;
              pMVar31->data = (void *)0x0;
              pMVar31->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
              pMVar31->dims = 0;
              pMVar31->w = 0;
              pMVar31->h = 0;
              pMVar31->d = 0;
              pMVar31->c = 0;
              pMVar31->data = local_f8.data;
              pMVar31->refcount = local_f8.refcount;
              pMVar31->elemsize = local_f8.elemsize;
              pMVar31->elempack = local_f8.elempack;
              pMVar31->allocator = local_f8.allocator;
              pMVar31->dims = local_f8.dims;
              pMVar31->w = local_f8.w;
              pMVar31->h = local_f8.h;
              pMVar31->d = local_f8.d;
              pMVar31->c = local_f8.c;
              pMVar31->cstep = local_f8.cstep;
            }
            if (local_f8.refcount != (int *)0x0) {
              LOCK();
              *local_f8.refcount = *local_f8.refcount + -1;
              UNLOCK();
              if (*local_f8.refcount == 0) {
                if (local_f8.allocator == (Allocator *)0x0) goto LAB_0059e4b6;
                (*(local_f8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_98.refcount != (int *)0x0) {
            LOCK();
            *local_98.refcount = *local_98.refcount + -1;
            UNLOCK();
            if (*local_98.refcount == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if ((long *)local_98.data != (long *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (local_148.refcount != (int *)0x0) {
            LOCK();
            *local_148.refcount = *local_148.refcount + -1;
            UNLOCK();
            if (*local_148.refcount == 0) {
              if (local_148.allocator == (Allocator *)0x0) {
                if ((Mat *)local_148.data != (Mat *)0x0) {
                  free(local_148.data);
                }
              }
              else {
                (*(local_148.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
          if (piVar2 == (int *)0x0) goto joined_r0x0059e928;
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 != 0) goto joined_r0x0059e928;
          if (local_1d8.allocator != (Allocator *)0x0) {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
            goto joined_r0x0059e928;
          }
        }
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
joined_r0x0059e928:
        if (cVar26 == '\0') {
          return 0;
        }
        return -100;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148,2,
                 (allocator_type *)&local_1d8);
      pvVar28 = local_148.data;
      if ((Mat *)local_148.data != this_00) {
        piVar2 = this_00->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = *(int **)((long)local_148.data + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (*(Allocator **)((long)local_148.data + 0x20) == (Allocator *)0x0) {
              if (*(void **)local_148.data != (void *)0x0) {
                free(*(void **)local_148.data);
              }
            }
            else {
              (*(*(Allocator **)((long)local_148.data + 0x20))->_vptr_Allocator[3])();
            }
          }
        }
        *(size_t *)((long)pvVar28 + 0x40) = 0;
        *(void **)pvVar28 = (void *)0x0;
        *(int **)((long)pvVar28 + 8) = (int *)0x0;
        *(undefined8 *)((long)((long)pvVar28 + 8) + 4) = 0;
        *(undefined8 *)((long)((long)pvVar28 + 0x10) + 4) = 0;
        *(undefined8 *)((long)pvVar28 + 0x28) = 0;
        *(undefined8 *)((long)pvVar28 + 0x30) = 0;
        *(int *)((long)pvVar28 + 0x38) = 0;
        piVar2 = this_00->refcount;
        *(void **)pvVar28 = this_00->data;
        *(int **)((long)pvVar28 + 8) = piVar2;
        *(size_t *)((long)pvVar28 + 0x10) = this_00->elemsize;
        *(int *)((long)pvVar28 + 0x18) = this_00->elempack;
        *(Allocator **)((long)pvVar28 + 0x20) = this_00->allocator;
        uVar6 = *(undefined8 *)&this_00->h;
        *(undefined8 *)((long)pvVar28 + 0x28) = *(undefined8 *)&this_00->dims;
        *(undefined8 *)((long)pvVar28 + 0x30) = uVar6;
        *(int *)((long)pvVar28 + 0x38) = this_00->c;
        *(size_t *)((long)pvVar28 + 0x40) = this_00->cstep;
      }
      iVar24 = 1;
      iVar1 = this_00[1].w;
      if ((local_150->super_MatMul).transB == 0) {
        iVar24 = this_00[1].w;
        iVar1 = 1;
      }
      Mat::reshape(&local_1d8,pMVar31,iVar1,iVar24,(Allocator *)0x0);
      if ((Mat *)((long)local_148.data + 0x48) != &local_1d8) {
        piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = ((Mat *)((long)local_148.data + 0x48))->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (((Mat *)((long)local_148.data + 0x48))->allocator == (Allocator *)0x0) {
              if (((Mat *)((long)local_148.data + 0x48))->data != (void *)0x0) {
                free(((Mat *)((long)local_148.data + 0x48))->data);
              }
            }
            else {
              (*((Mat *)((long)local_148.data + 0x48))->allocator->_vptr_Allocator[3])();
            }
          }
        }
        ((Mat *)((long)local_148.data + 0x48))->cstep = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->refcount + 4) = 0;
        *(undefined8 *)((long)&((Mat *)((long)local_148.data + 0x48))->elemsize + 4) = 0;
        ((Mat *)((long)local_148.data + 0x48))->data = (void *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->refcount = (int *)0x0;
        ((Mat *)((long)local_148.data + 0x48))->dims = 0;
        ((Mat *)((long)local_148.data + 0x48))->w = 0;
        ((Mat *)((long)local_148.data + 0x48))->h = 0;
        ((Mat *)((long)local_148.data + 0x48))->d = 0;
        ((Mat *)((long)local_148.data + 0x48))->c = 0;
        ((Mat *)((long)local_148.data + 0x48))->data = local_1d8.data;
        ((Mat *)((long)local_148.data + 0x48))->refcount =
             (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        ((Mat *)((long)local_148.data + 0x48))->elemsize =
             CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        ((Mat *)((long)local_148.data + 0x48))->elempack = local_1d8.elempack;
        ((Mat *)((long)local_148.data + 0x48))->allocator = local_1d8.allocator;
        ((Mat *)((long)local_148.data + 0x48))->dims = local_1d8.dims;
        ((Mat *)((long)local_148.data + 0x48))->w = local_1d8.w;
        ((Mat *)((long)local_148.data + 0x48))->h = local_1d8.h;
        ((Mat *)((long)local_148.data + 0x48))->d = local_1d8.d;
        ((Mat *)((long)local_148.data + 0x48))->c = local_1d8.c;
        ((Mat *)((long)local_148.data + 0x48))->cstep = local_1d8.cstep;
      }
      pOVar19 = local_b0;
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            if (local_1d8.data != (void *)0x0) {
              free(local_1d8.data);
            }
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*local_150->gemm->_vptr_Layer[6])(local_150->gemm,&local_148,top_blobs,pOVar19);
      pMVar31 = local_100;
      Mat::reshape(&local_1d8,local_100,local_100->h,pOVar19->blob_allocator);
      if (pMVar31 != &local_1d8) {
        piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = pMVar31->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (pMVar31->allocator == (Allocator *)0x0) {
              if (pMVar31->data != (void *)0x0) {
                free(pMVar31->data);
              }
            }
            else {
              (*pMVar31->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar31->cstep = 0;
        pMVar31->data = (void *)0x0;
        pMVar31->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar31->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar31->elemsize + 4) = 0;
        pMVar31->dims = 0;
        pMVar31->w = 0;
        pMVar31->h = 0;
        pMVar31->d = 0;
        pMVar31->c = 0;
        pMVar31->data = local_1d8.data;
        pMVar31->refcount = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
        pMVar31->elemsize = CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
        pMVar31->elempack = local_1d8.elempack;
        pMVar31->allocator = local_1d8.allocator;
        pMVar31->dims = local_1d8.dims;
        pMVar31->w = local_1d8.w;
        pMVar31->h = local_1d8.h;
        pMVar31->d = local_1d8.d;
        pMVar31->c = local_1d8.c;
        pMVar31->cstep = local_1d8.cstep;
      }
      piVar2 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar2 == (int *)0x0) goto LAB_0059d4f7;
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 != 0) goto LAB_0059d4f7;
      if (local_1d8.allocator != (Allocator *)0x0) {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
        goto LAB_0059d4f7;
      }
    }
  }
  if (local_1d8.data != (void *)0x0) {
    free(local_1d8.data);
  }
LAB_0059d4f7:
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_148);
  return 0;
}

Assistant:

int MatMul_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int Adims = A.dims;
    const int Bdims = B.dims;
    const int max_ABdims = std::max(Adims, Bdims);
    const size_t elemsize = A.elemsize;

    if (Adims == 1 && Bdims == 1)
    {
        // dot product
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(1, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 2)
    {
        // matrix multiply
        gemm->forward(bottom_blobs, top_blobs, opt);
    }
    else if (Adims == 1 && Bdims == 2)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A.reshape(A.w, 1);
        _bottom_blobs[1] = B;
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.w, opt.blob_allocator);
    }
    else if (Adims == 2 && Bdims == 1)
    {
        // matrix multiply
        std::vector<Mat> _bottom_blobs(2);
        _bottom_blobs[0] = A;
        _bottom_blobs[1] = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);
        gemm->forward(_bottom_blobs, top_blobs, opt);

        top_blob = top_blob.reshape(top_blob.h, opt.blob_allocator);
    }
    else if (Adims == 1 && Bdims > 2)
    {
        // batched matrix multiply
        const int N = transB == 0 ? B.w : B.h;
        const int batch_size = B.d * B.c;

        Mat top_blob1(N, 1, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, 1);
        Mat B1 = B.reshape(B.w, B.h, batch_size);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1;
            _bottom_blobs[1] = B1.channel(p);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Bdims == 3)
            top_blob = top_blob1.reshape(N, B.d * B.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(N, B.d, B.c, opt.blob_allocator);
    }
    else if (Adims > 2 && Bdims == 1)
    {
        // batched matrix multiply
        const int M = A.h;
        const int batch_size = A.d * A.c;

        Mat top_blob1(1, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob1.empty())
            return -100;

        Mat A1 = A.reshape(A.w, A.h, batch_size);
        Mat BT = transB ? B.reshape(B.w, 1) : B.reshape(1, B.w);

        for (int p = 0; p < batch_size; p++)
        {
            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(p);
            _bottom_blobs[1] = BT;
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob1.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }

        if (Adims == 3)
            top_blob = top_blob1.reshape(M, A.d * A.c, opt.blob_allocator);
        else
            top_blob = top_blob1.reshape(M, A.d, A.c, opt.blob_allocator);
    }
    else if (max_ABdims == 3)
    {
        Mat A1 = Adims == 2 ? A.reshape(A.w, A.h, 1) : A;
        Mat B1 = Bdims == 2 ? B.reshape(B.w, B.h, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            std::vector<Mat> _bottom_blobs(2);
            _bottom_blobs[0] = A1.channel(Ap);
            _bottom_blobs[1] = B1.channel(Bp);
            std::vector<Mat> _top_blobs(1);
            _top_blobs[0] = top_blob.channel(p);
            gemm->forward(_bottom_blobs, _top_blobs, opt);
        }
    }
    else if (max_ABdims == 4)
    {
        Mat A1 = Adims == 3 ? A.reshape(A.w, A.h, A.c, 1) : A;
        Mat B1 = Bdims == 3 ? B.reshape(B.w, B.h, B.c, 1) : B;

        const int M = A1.h;
        const int N = transB == 0 ? B1.w : B1.h;
        const int batch_size_d = std::max(A1.d, B1.d);
        const int batch_size_c = std::max(A1.c, B1.c);

        top_blob.create(N, M, batch_size_d, batch_size_c, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        for (int p = 0; p < batch_size_c; p++)
        {
            int Ap = A1.c == 1 ? 0 : p;
            int Bp = B1.c == 1 ? 0 : p;

            for (int q = 0; q < batch_size_d; q++)
            {
                int Ad = A1.d == 1 ? 0 : q;
                int Bd = B1.d == 1 ? 0 : q;

                std::vector<Mat> _bottom_blobs(2);
                _bottom_blobs[0] = A1.channel(Ap).depth(Ad);
                _bottom_blobs[1] = B1.channel(Bp).depth(Bd);
                std::vector<Mat> _top_blobs(1);
                _top_blobs[0] = top_blob.channel(p).depth(q);
                gemm->forward(_bottom_blobs, _top_blobs, opt);
            }
        }
    }
    else
    {
        NCNN_LOGE("impossible matmul %d %d", Adims, Bdims);
        return -1;
    }

    return 0;
}